

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

boolean create_drawbridge(level *lev,int x,int y,int dir,boolean flag)

{
  char cVar1;
  bool bVar2;
  int local_30;
  boolean lava;
  int iStack_2c;
  boolean horiz;
  int y2;
  int x2;
  boolean flag_local;
  int dir_local;
  int y_local;
  int x_local;
  level *lev_local;
  
  cVar1 = lev->locations[x][y].typ;
  local_30 = y;
  iStack_2c = x;
  switch(dir) {
  case 0:
    bVar2 = true;
    local_30 = y + -1;
    break;
  case 1:
    bVar2 = true;
    local_30 = y + 1;
    break;
  case 2:
    bVar2 = false;
    iStack_2c = x + 1;
    break;
  default:
    impossible("bad direction in create_drawbridge");
  case 3:
    bVar2 = false;
    iStack_2c = x + -1;
  }
  if ((lev->locations[iStack_2c][local_30].typ == '\0') ||
     ('\f' < lev->locations[iStack_2c][local_30].typ)) {
    lev_local._7_1_ = '\0';
  }
  else {
    if (flag == '\0') {
      lev->locations[x][y].typ = '\x14';
      lev->locations[iStack_2c][local_30].typ = '\f';
      *(uint *)&lev->locations[iStack_2c][local_30].field_0x6 =
           *(uint *)&lev->locations[iStack_2c][local_30].field_0x6 & 0xfffffe0f | 0x80;
    }
    else {
      lev->locations[x][y].typ = '$';
      lev->locations[iStack_2c][local_30].typ = '\x17';
      *(uint *)&lev->locations[iStack_2c][local_30].field_0x6 =
           *(uint *)&lev->locations[iStack_2c][local_30].field_0x6 & 0xfffffe0f;
    }
    *(uint *)&lev->locations[x][y].field_0x6 =
         *(uint *)&lev->locations[x][y].field_0x6 & 0xfffffdff | (uint)!bVar2 << 9;
    *(uint *)&lev->locations[iStack_2c][local_30].field_0x6 =
         *(uint *)&lev->locations[iStack_2c][local_30].field_0x6 & 0xfffffdff | (uint)bVar2 << 9;
    *(uint *)&lev->locations[x][y].field_0x6 =
         *(uint *)&lev->locations[x][y].field_0x6 & 0xfffffe0f | (dir & 0x1fU) << 4;
    if (cVar1 == '\x15') {
      *(uint *)&lev->locations[x][y].field_0x6 =
           *(uint *)&lev->locations[x][y].field_0x6 & 0xfffffe0f |
           (*(uint *)&lev->locations[x][y].field_0x6 >> 4 & 0x1f | 4) << 4;
    }
    lev_local._7_1_ = '\x01';
  }
  return lev_local._7_1_;
}

Assistant:

boolean create_drawbridge(struct level *lev, int x, int y, int dir, boolean flag)
{
	int x2,y2;
	boolean horiz;
	boolean lava = lev->locations[x][y].typ == LAVAPOOL; /* assume initialized map */

	x2 = x; y2 = y;
	switch(dir) {
		case DB_NORTH:
			horiz = TRUE;
			y2--;
			break;
		case DB_SOUTH:
			horiz = TRUE;
			y2++;
			break;
		case DB_EAST:
			horiz = FALSE;
			x2++;
			break;
		default:
			impossible("bad direction in create_drawbridge");
			/* fall through */
		case DB_WEST:
			horiz = FALSE;
			x2--;
			break;
	}
	if (!IS_WALL(lev->locations[x2][y2].typ))
		return FALSE;
	if (flag) {             /* We want the bridge open */
		lev->locations[x][y].typ = DRAWBRIDGE_DOWN;
		lev->locations[x2][y2].typ = DOOR;
		lev->locations[x2][y2].doormask = D_NODOOR;
	} else {
		lev->locations[x][y].typ = DRAWBRIDGE_UP;
		lev->locations[x2][y2].typ = DBWALL;
		/* Drawbridges are non-diggable. */
		lev->locations[x2][y2].wall_info = W_NONDIGGABLE;
	}
	lev->locations[x][y].horizontal = !horiz;
	lev->locations[x2][y2].horizontal = horiz;
	lev->locations[x][y].drawbridgemask = dir;
	if (lava) lev->locations[x][y].drawbridgemask |= DB_LAVA;
	return TRUE;
}